

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Input::beginBitSetScalar(Input *this,bool *DoClear)

{
  HNode *pHVar1;
  ret_type pSVar2;
  const_iterator __position;
  Child local_40 [3];
  
  pHVar1 = this->CurrentNode;
  (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  pSVar2 = dyn_cast<llvm::yaml::Input::SequenceHNode,llvm::yaml::Input::HNode>(pHVar1);
  if (pSVar2 == (ret_type)0x0) {
    pHVar1 = this->CurrentNode;
    Twine::Twine((Twine *)local_40,"expected sequence of bit values");
    setError(this,pHVar1,(Twine *)local_40);
  }
  else {
    local_40[0].character = '\0';
    __position.super__Bit_iterator_base._8_8_ = 0;
    __position.super__Bit_iterator_base._M_p =
         (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    std::vector<bool,_std::allocator<bool>_>::insert
              (&this->BitValuesUsed,__position,
               (long)(pSVar2->Entries).
                     super__Vector_base<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pSVar2->Entries).
                     super__Vector_base<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_40[0].character);
  }
  *DoClear = true;
  return true;
}

Assistant:

bool Input::beginBitSetScalar(bool &DoClear) {
  BitValuesUsed.clear();
  if (SequenceHNode *SQ = dyn_cast<SequenceHNode>(CurrentNode)) {
    BitValuesUsed.insert(BitValuesUsed.begin(), SQ->Entries.size(), false);
  } else {
    setError(CurrentNode, "expected sequence of bit values");
  }
  DoClear = true;
  return true;
}